

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

uint __thiscall FM::OPNA::GetReg(OPNA *this,uint addr)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (addr < 0x10) {
    uVar4 = (uint)(this->super_OPNABase).super_OPNBase.psg.reg[addr];
  }
  else if (addr == 0xff) {
    uVar4 = 1;
  }
  else if (addr == 0x108) {
    uVar2 = (this->super_OPNABase).adpcmreadbuf;
    uVar4 = uVar2 & 0xff;
    (this->super_OPNABase).adpcmreadbuf = uVar2 >> 8;
    if (((this->super_OPNABase).control1 & 0x60) == 0x20) {
      uVar3 = OPNABase::ReadRAM(&this->super_OPNABase);
      puVar1 = &(this->super_OPNABase).adpcmreadbuf;
      *puVar1 = *puVar1 | uVar3 << 8;
    }
  }
  else {
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

uint OPNA::GetReg(uint addr)
{
	if (addr < 0x10)
		return psg.GetReg(addr);

	if (addr == 0x108)
	{
//		LOG1("%d:reg[108] ->   ", Diag::GetCPUTick());

		uint data = adpcmreadbuf & 0xff;
		adpcmreadbuf >>= 8;
		if ((control1 & 0x60) == 0x20)
		{
			adpcmreadbuf |= ReadRAM() << 8;
//			LOG2("Rd [0x%.6x:%.2x] ", memaddr, adpcmreadbuf >> 8);
		}
//		LOG0("%.2x\n");
		return data;
	}

	if (addr == 0xff)
		return 1;

	return 0;
}